

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

tuple<bool,_unsigned_int,_unsigned_int> __thiscall V4L2Device::parse_resolution(V4L2Device *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  undefined4 extraout_EDX;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> in_RDI;
  tuple<bool,_unsigned_int,_unsigned_int> tVar5;
  invalid_argument *exc;
  out_of_range *exc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> y_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x_str;
  size_type delimeter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resolution;
  bool ok;
  uint32_t y;
  uint32_t x;
  undefined4 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3c;
  DispatchAction in_stack_fffffffffffffd3e;
  Writer *in_stack_fffffffffffffd40;
  Writer *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  Level in_stack_fffffffffffffd5e;
  Writer *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  VerboseLevel in_stack_fffffffffffffd70;
  undefined6 in_stack_fffffffffffffd72;
  Writer local_230 [2];
  string local_c0 [32];
  string local_a0 [32];
  long local_80;
  allocator local_61;
  string local_60 [32];
  string local_40 [39];
  undefined1 local_19;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = 0;
  local_18 = 0;
  local_19 = 1;
  std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffd40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"resolution",&local_61);
  cxxopts::Options::operator[]
            ((Options *)CONCAT62(in_stack_fffffffffffffd72,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68);
  pbVar1 = cxxopts::OptionDetails::as<std::__cxx11::string>
                     ((OptionDetails *)in_stack_fffffffffffffd40);
  std::__cxx11::string::string(local_40,(string *)pbVar1);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_80 = std::__cxx11::string::find((char *)local_40,0x215c8b);
  if (local_80 != -1) {
    uVar2 = local_80 + 1;
    uVar3 = std::__cxx11::string::size();
    if (uVar2 < uVar3) {
      std::__cxx11::string::substr((ulong)local_a0,(ulong)local_40);
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_c0,(ulong)local_40);
      uVar4 = std::__cxx11::stoul((string *)in_stack_fffffffffffffd40,
                                  (size_t *)
                                  CONCAT26(in_stack_fffffffffffffd3e,
                                           CONCAT24(in_stack_fffffffffffffd3c,
                                                    in_stack_fffffffffffffd38)),0);
      local_14 = (undefined4)uVar4;
      uVar4 = std::__cxx11::stoul((string *)in_stack_fffffffffffffd40,
                                  (size_t *)
                                  CONCAT26(in_stack_fffffffffffffd3e,
                                           CONCAT24(in_stack_fffffffffffffd3c,
                                                    in_stack_fffffffffffffd38)),0);
      local_18 = (undefined4)uVar4;
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      goto LAB_001e8ff7;
    }
  }
  in_stack_fffffffffffffd38 = 0;
  el::base::Writer::Writer
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5e,in_stack_fffffffffffffd50,
             (LineNumber)in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd3e,in_stack_fffffffffffffd70);
  in_stack_fffffffffffffd48 =
       el::base::Writer::construct(local_230,1,el::base::consts::kDefaultLoggerId);
  in_stack_fffffffffffffd40 =
       el::base::Writer::operator<<
                 (in_stack_fffffffffffffd40,
                  (char (*) [33])
                  CONCAT26(in_stack_fffffffffffffd3e,
                           CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
  el::base::Writer::operator<<
            (in_stack_fffffffffffffd40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffd3e,
                      CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
  el::base::Writer::~Writer(in_stack_fffffffffffffd40);
  local_19 = 0;
LAB_001e8ff7:
  std::make_tuple<bool&,unsigned_int&,unsigned_int&>
            ((bool *)in_stack_fffffffffffffd48,(uint *)in_stack_fffffffffffffd40,
             (uint *)CONCAT26(in_stack_fffffffffffffd3e,
                              CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
  std::__cxx11::string::~string(local_40);
  tVar5.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>._8_4_ = extraout_EDX;
  tVar5.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> = in_RDI;
  return (tuple<bool,_unsigned_int,_unsigned_int>)
         tVar5.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>;
}

Assistant:

std::tuple<bool, uint32_t, uint32_t>
    parse_resolution()
    {
        uint32_t x = 0, y = 0;
        bool ok = true;

        auto resolution = (*options)["resolution"].as<std::string>();
        auto delimeter = resolution.find("x");

        if ((delimeter != std::string::npos) and (delimeter + 1 < resolution.size())) {
            auto x_str = resolution.substr(0, delimeter);
            auto y_str = resolution.substr(delimeter + 1, resolution.size() - 1);

            try {
                x = std::stoul(x_str);
                y = std::stoul(y_str);
            } catch (std::invalid_argument& exc) {
                LOG(ERROR) << "no conversion could be performed: " << exc.what();
                ok = false;
            } catch (std::out_of_range& exc) {
                LOG(ERROR) << "out of range error: " << exc.what();
                ok = false;
            }
        } else {
            LOG(ERROR) << "invalid resolution description: " << resolution;
            ok = false;
        }

        return std::make_tuple(ok, x, y);
    }